

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O1

void p_crypto_hash_sha2_512_finish(PHashSHA2_512 *ctx)

{
  int iVar1;
  puint64 pVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  pVar2 = ctx->len_high;
  uVar3 = ctx->len_low;
  uVar7 = (uint)uVar3 & 0x7f;
  uVar4 = (uint)(0x6f < uVar7) << 7 | 0x70;
  uVar5 = uVar4 - uVar7;
  if (uVar5 != 0 && uVar7 <= uVar4) {
    p_crypto_hash_sha2_512_update(ctx,pp_crypto_hash_sha2_512_pad,(ulong)uVar5);
  }
  (ctx->buf).buf_w[0xe] = pVar2 << 3 | uVar3 >> 0x3d;
  (ctx->buf).buf_w[0xf] = uVar3 << 3;
  lVar6 = 0;
  do {
    uVar3 = ctx->hash[lVar6 + -0x10];
    ctx->hash[lVar6 + -0x10] =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    lVar6 = lVar6 + 1;
  } while ((int)lVar6 != 0xe);
  pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
  iVar1 = ctx->is384;
  lVar6 = 0;
  do {
    uVar3 = ctx->hash[lVar6];
    ctx->hash[lVar6] =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    lVar6 = lVar6 + 1;
  } while ((uint)(iVar1 == 0) * 2 + 6 != (int)lVar6);
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_finish (PHashSHA2_512 *ctx)
{
	puint64	high;
	puint64	low;
	pint	left;
	pint	last;

	left = (pint) (ctx->len_low & 0x7F);
	last = (left < 112) ? (112 - left) : (240 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 61;

	if (last > 0)
		p_crypto_hash_sha2_512_update (ctx, pp_crypto_hash_sha2_512_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha2_512_swap_bytes (ctx->hash, ctx->is384 == FALSE ? 8 : 6);
}